

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O3

UBool __thiscall
icu_63::ResourceTable::getKeyAndValue(ResourceTable *this,int32_t i,char **key,ResourceValue *value)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  _func_int *p_Var4;
  ulong uVar5;
  _func_int **pp_Var6;
  
  if (i < 0) {
    return '\0';
  }
  if (this->length <= i) {
    return '\0';
  }
  if (this->keys16 == (uint16_t *)0x0) {
    uVar5 = (ulong)this->keys32[(uint)i];
    pp_Var6 = value[1].super_UObject._vptr_UObject;
    if ((long)uVar5 < 0) {
      p_Var4 = pp_Var6[3] + (this->keys32[(uint)i] & 0x7fffffff);
      goto LAB_002f6039;
    }
  }
  else {
    uVar1 = this->keys16[(uint)i];
    uVar5 = (ulong)uVar1;
    pp_Var6 = value[1].super_UObject._vptr_UObject;
    if (*(int *)((long)pp_Var6 + 0x24) <= (int)(uint)uVar1) {
      p_Var4 = pp_Var6[3] + (uVar5 - (long)*(int *)((long)pp_Var6 + 0x24));
      goto LAB_002f6039;
    }
  }
  p_Var4 = pp_Var6[1] + uVar5;
LAB_002f6039:
  *key = (char *)p_Var4;
  if (this->items16 == (uint16_t *)0x0) {
    uVar3 = this->items32[(uint)i];
  }
  else {
    pp_Var6 = value[1].super_UObject._vptr_UObject;
    uVar1 = this->items16[(uint)i];
    uVar3 = (uint)uVar1;
    iVar2 = *(int *)((long)pp_Var6 + 0x34);
    if (iVar2 <= (int)(uint)uVar1) {
      uVar3 = ((uint)uVar1 - iVar2) + *(int *)(pp_Var6 + 6);
    }
    uVar3 = uVar3 | 0x60000000;
  }
  *(uint *)&value[2].super_UObject._vptr_UObject = uVar3;
  return '\x01';
}

Assistant:

UBool icu::ResourceTable::getKeyAndValue(int32_t i,
                                         const char *&key, icu::ResourceValue &value) const {
    if(0 <= i && i < length) {
        icu::ResourceDataValue &rdValue = static_cast<icu::ResourceDataValue &>(value);
        if (keys16 != NULL) {
            key = RES_GET_KEY16(rdValue.pResData, keys16[i]);
        } else {
            key = RES_GET_KEY32(rdValue.pResData, keys32[i]);
        }
        Resource res;
        if (items16 != NULL) {
            res = makeResourceFrom16(rdValue.pResData, items16[i]);
        } else {
            res = items32[i];
        }
        rdValue.setResource(res);
        return TRUE;
    }
    return FALSE;
}